

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate(QXmlStreamReaderPrivate *this)

{
  free(this->sym_stack);
  free(this->state_stack);
  std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
  ~unique_ptr(&this->entityParser);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::~QXmlStreamSimpleStack
            (&this->attributeStack);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->textBuffer).d);
  QArrayDataPointer<QXmlStreamEntityDeclaration>::~QArrayDataPointer
            (&(this->publicEntityDeclarations).d);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::~QXmlStreamSimpleStack
            (&this->entityDeclarations);
  QArrayDataPointer<QXmlStreamNamespaceDeclaration>::~QArrayDataPointer
            (&(this->publicNamespaceDeclarations).d);
  QArrayDataPointer<QXmlStreamNotationDeclaration>::~QArrayDataPointer
            (&(this->publicNotationDeclarations).d);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::~QXmlStreamSimpleStack
            (&this->notationDeclarations);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::~QXmlStreamSimpleStack
            (&this->dtdAttributes);
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&this->attributes);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->unresolvedEntity).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->errorString).d);
  QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference>::~QXmlStreamSimpleStack
            (&this->entityReferenceStack);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash(&this->parameterEntityHash);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash(&this->entityHash);
  QXmlStreamSimpleStack<unsigned_int>::~QXmlStreamSimpleStack(&this->putStack);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->readBuffer).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->dataBuffer).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->rawReadBuffer).d);
  QXmlStreamPrivateTagStack::~QXmlStreamPrivateTagStack(&this->super_QXmlStreamPrivateTagStack);
  return;
}

Assistant:

QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate()
{
    free(sym_stack);
    free(state_stack);
}